

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# files.cpp
# Opt level: O0

size_t __thiscall BufferWriter::Write(BufferWriter *this,void *buffer,size_t len)

{
  uint uVar1;
  uchar *__dest;
  uint ofs;
  size_t len_local;
  void *buffer_local;
  BufferWriter *this_local;
  
  uVar1 = TArray<unsigned_char,_unsigned_char>::Reserve(&this->mBuffer,(uint)len);
  __dest = TArray<unsigned_char,_unsigned_char>::operator[](&this->mBuffer,(ulong)uVar1);
  memcpy(__dest,buffer,len);
  return len;
}

Assistant:

size_t BufferWriter::Write(const void *buffer, size_t len)
{
	unsigned int ofs = mBuffer.Reserve((unsigned)len);
	memcpy(&mBuffer[ofs], buffer, len);
	return len;
}